

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

void Llb_ManMinCutTest(Aig_Man_t *pAig,int Num)

{
  Aig_Man_t *p;
  Vec_Ptr_t *vResult;
  int i;
  long lVar1;
  Gia_ParLlb_t local_a8;
  
  local_a8.nPartValue = 0;
  local_a8.fBackward = 0;
  local_a8.TimeLimitGlo = 0;
  local_a8._92_4_ = 0;
  local_a8.fDumpReached = 0;
  local_a8.TimeTarget = 0;
  local_a8.fVerbose = 0;
  local_a8.fVeryVerbose = 0;
  local_a8.fSilent = 0;
  local_a8.fSkipReach = 0;
  local_a8.nBddMax = 1000000;
  local_a8.nIterMax = 10000000;
  local_a8.nClusterMax = 0x14;
  local_a8.nHintDepth = 0;
  local_a8.HintFirst = 0;
  local_a8.fUseFlow = 0;
  local_a8.nVolumeMax = 100;
  local_a8.nVolumeMin = 0x1e;
  local_a8.fReorder = 1;
  local_a8.fSkipOutCheck = 0;
  local_a8.TimeLimit = 0;
  local_a8.fIndConstr = 0;
  local_a8.fUsePivots = 0;
  local_a8.fCluster = 0;
  local_a8.fSchedule = 0;
  local_a8.iFrame = -1;
  local_a8._108_4_ = 0;
  p = Aig_ManDupFlopsOnly(pAig);
  Aig_ManPrintStats(pAig);
  Aig_ManPrintStats(p);
  Aig_ManFanoutStart(p);
  vResult = Llb_ManComputeCuts(p,Num,1,0);
  Llb_CoreExperiment(pAig,p,&local_a8,vResult,0);
  for (lVar1 = 0; lVar1 < vResult->nSize; lVar1 = lVar1 + 1) {
    if ((Vec_Ptr_t *)vResult->pArray[lVar1] != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree((Vec_Ptr_t *)vResult->pArray[lVar1]);
    }
  }
  Vec_PtrFree(vResult);
  Aig_ManFanoutStop(p);
  Aig_ManCleanMarkAB(p);
  Aig_ManStop(p);
  return;
}

Assistant:

void Llb_ManMinCutTest( Aig_Man_t * pAig, int Num )
{
    extern void Llb_BddConstructTest( Aig_Man_t * p, Vec_Ptr_t * vResult );
    extern void Llb_BddExperiment( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t * pPars, Vec_Ptr_t * vResult, Vec_Ptr_t * vMaps );
 

//    int fVerbose = 1;
    Gia_ParLlb_t Pars, * pPars = &Pars;
    Vec_Ptr_t * vResult;//, * vSupps, * vMaps;
    Aig_Man_t * p;

    Llb_BddSetDefaultParams( pPars );

    p = Aig_ManDupFlopsOnly( pAig );
//Aig_ManShow( p, 0, NULL );
    Aig_ManPrintStats( pAig );
    Aig_ManPrintStats( p );
    Aig_ManFanoutStart( p );

    vResult = Llb_ManComputeCuts( p, Num, 1, 0 );
//    vSupps  = Llb_ManCutSupps( p, vResult );
//    vMaps   = Llb_ManCutMap( p, vResult, vSupps );

//    Llb_BddExperiment( pAig, p, pPars, vResult, vMaps );
    Llb_CoreExperiment( pAig, p, pPars, vResult, 0 );

//    Vec_VecFree( (Vec_Vec_t *)vMaps );
//    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Vec_VecFree( (Vec_Vec_t *)vResult );

    Aig_ManFanoutStop( p );
    Aig_ManCleanMarkAB( p );
    Aig_ManStop( p );
}